

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

MutableStringView __thiscall
Corrade::Containers::String::findAnyOr(String *this,StringView characters,char *fail)

{
  char *begin;
  BasicStringView<char> BVar1;
  MutableStringView MVar2;
  BasicStringView<char> local_30;
  
  BasicStringView<char>::BasicStringView(&local_30,this);
  begin = Implementation::stringFindAny
                    (local_30._data,local_30._sizePlusFlags & 0x3fffffffffffffff,characters._data,
                     characters._sizePlusFlags & 0x3fffffffffffffff);
  if (begin == (char *)0x0) {
    BVar1._sizePlusFlags = 0;
    BVar1._data = fail;
  }
  else {
    BVar1 = BasicStringView<char>::slice(&local_30,begin,begin + 1);
  }
  MVar2._data = BVar1._data;
  MVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return MVar2;
}

Assistant:

MutableStringView String::findAnyOr(const StringView characters, char* fail) {
    return MutableStringView{*this}.findAnyOr(characters, fail);
}